

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler.h
# Opt level: O0

void __thiscall WangLandauSampler::perform_round_trip(WangLandauSampler *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint triangles;
  bool going_up;
  WangLandauSampler *this_local;
  
  bVar1 = true;
  do {
    while( true ) {
      (**(this->super_UniformSampler)._vptr_UniformSampler)();
      uVar2 = Network::get_triangles((this->super_UniformSampler).network);
      uVar3 = Histogram<unsigned_int>::bin
                        ((this->super_UniformSampler).super_Sampler.histogram,uVar2);
      uVar4 = Histogram<unsigned_int>::bins((this->super_UniformSampler).super_Sampler.histogram);
      if ((uVar3 != uVar4) || (!bVar1)) break;
      bVar1 = false;
    }
    uVar2 = Histogram<unsigned_int>::bin((this->super_UniformSampler).super_Sampler.histogram,uVar2)
    ;
  } while ((uVar2 != 0) || (bVar1));
  return;
}

Assistant:

void perform_round_trip() {
        bool going_up = true;

        while (true) {
            markov_step();
            unsigned int triangles = network.get_triangles();

            // round-trip control
            if (histogram.bin(triangles) == histogram.bins()
                and going_up) {
                going_up = false;
                //std::cout << "reached up\n";
            }
            else if (histogram.bin(triangles) == 0
                     and not going_up) {
                //std::cout << "reached down\n";
                break;
            }
        }
    }